

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detour.c
# Opt level: O1

int detour_initialize(void)

{
  int iVar1;
  
  iVar1 = plugin_manager_initialize
                    (&detour_manager,"detour","DETOUR_LIBRARY_PATH","/usr/local/lib",0,0);
  return iVar1;
}

Assistant:

int detour_initialize(void)
{
	return plugin_manager_initialize(
		&detour_manager,
		DETOUR_MANAGER_NAME,
		DETOUR_LIBRARY_PATH,
#if defined(DETOUR_LIBRARY_INSTALL_PATH)
		DETOUR_LIBRARY_INSTALL_PATH,
#else
		DETOUR_LIBRARY_DEFAULT_PATH,
#endif /* DETOUR_LIBRARY_INSTALL_PATH */
		NULL,
		NULL);
}